

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O1

real __thiscall
fasttext::ProductQuantizer::mulcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  real *prVar5;
  ulong uVar6;
  pointer pfVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  undefined1 auVar11 [64];
  
  iVar1 = this->nsubq_;
  if ((long)iVar1 < 1) {
    fVar10 = 0.0;
  }
  else {
    iVar2 = this->dsub_;
    uVar3 = this->lastdsub_;
    pfVar7 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar11 = ZEXT864(0);
    uVar9 = 0;
    uVar8 = (long)iVar2;
    do {
      prVar5 = get_centroids(this,(int32_t)uVar9,codes[uVar9 + (long)(t * iVar1)]);
      uVar8 = uVar8 & 0xffffffff;
      if (uVar9 == iVar1 - 1) {
        uVar8 = (ulong)uVar3;
      }
      if ((int)uVar8 < 1) {
        auVar11 = ZEXT464(auVar11._0_4_);
      }
      else {
        uVar6 = 0;
        auVar11 = ZEXT464(auVar11._0_4_);
        do {
          auVar4 = vfmadd231ss_fma(auVar11._0_16_,ZEXT416((uint)pfVar7[uVar6]),
                                   ZEXT416((uint)prVar5[uVar6]));
          auVar11 = ZEXT1664(auVar4);
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
      fVar10 = auVar11._0_4_;
      uVar9 = uVar9 + 1;
      pfVar7 = pfVar7 + iVar2;
    } while (uVar9 != (long)iVar1);
  }
  return fVar10 * alpha;
}

Assistant:

real ProductQuantizer::mulcode(
    const Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  real res = 0.0;
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      res += x[m * dsub_ + n] * c[n];
    }
  }
  return res * alpha;
}